

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O2

void * parseElement(SymbolContext<char> *ctx)

{
  bool bVar1;
  XMLElement *this;
  XMLElement *pXVar2;
  string n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this = (XMLElement *)operator_new(0x88);
  XMLElement::XMLElement(this,ctx);
  std::__cxx11::string::string((string *)&local_30,(string *)this);
  bVar1 = std::operator==(&local_30,"article");
  if (bVar1) {
    pXVar2 = XMLElementBody::get_element(&this->m_body,"year");
    if (pXVar2 != (XMLElement *)0x0) {
      bVar1 = std::operator==(&(pXVar2->m_body).m_content,"1990");
      if (bVar1) goto LAB_0011025d;
    }
    XMLElement::~XMLElement(this);
    operator_delete(this);
    this = (XMLElement *)operator_new(0x88);
    XMLElement::XMLElement(this,&local_30);
  }
  else {
    bVar1 = std::operator==(&local_30,"inproceedings");
    if (!bVar1) {
      bVar1 = std::operator==(&local_30,"proceedings");
      if (!bVar1) {
        bVar1 = std::operator==(&local_30,"book");
        if (!bVar1) {
          bVar1 = std::operator==(&local_30,"incollection");
          if (!bVar1) {
            bVar1 = std::operator==(&local_30,"phdthesis");
            if (!bVar1) {
              bVar1 = std::operator==(&local_30,"mastersthesis");
              if (!bVar1) {
                bVar1 = std::operator==(&local_30,"www");
                if (!bVar1) goto LAB_0011025d;
              }
            }
          }
        }
      }
    }
    XMLElement::~XMLElement(this);
    operator_delete(this);
    this = (XMLElement *)operator_new(0x88);
    XMLElement::XMLElement(this,&local_30);
  }
LAB_0011025d:
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

void *parseElement(const SymbolContext<char>& ctx)
{
    XMLElement *elem = new XMLElement(ctx);

    std::string n = elem->get_name();
    if (n == "article")
    {
        const XMLElement *year = elem->get_element("year");
        if (year != nullptr && year->get_content() == "1990")
        {
          // count++
        }
        else
        {
            delete elem;
            return new XMLElement(n);
        }
    }
    else if (n == "inproceedings" || n == "proceedings" || n == "book" || n == "incollection" || n == "phdthesis" || n == "mastersthesis" || n == "www")
    {
        delete elem;
        return new XMLElement(n);
    }
    return elem;
}